

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_vec3_double(void *a,double **vertices,trico_stream_type st)

{
  ssize_t sVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_doubles_z;
  uint32_t nr_of_doubles_y;
  uint32_t nr_of_doubles_x;
  uint32_t nr_vertices;
  double *decompressed_z;
  double *decompressed_y;
  double *decompressed_x;
  
  iVar3 = 0;
  if (*(trico_stream_type *)((long)a + 0x24) == st) {
    sVar1 = read((int)&nr_vertices,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      iVar3 = 0;
    }
    else {
      sVar1 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      iVar3 = 0;
      if ((int)sVar1 != 0) {
        uVar4 = (ulong)nr_of_compressed_bytes;
        puVar2 = (uint8_t *)malloc(uVar4);
        sVar1 = read((int)puVar2,(void *)0x1,uVar4);
        iVar3 = 0;
        if ((int)sVar1 != 0) {
          trico_decompress_double_precision(&nr_of_doubles_x,&decompressed_x,puVar2);
          sVar1 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
          iVar3 = 0;
          if ((int)sVar1 != 0) {
            uVar4 = (ulong)nr_of_compressed_bytes;
            puVar2 = (uint8_t *)realloc(puVar2,uVar4);
            sVar1 = read((int)puVar2,(void *)0x1,uVar4);
            if ((int)sVar1 != 0) {
              trico_decompress_double_precision(&nr_of_doubles_y,&decompressed_y,puVar2);
              sVar1 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
              iVar3 = 0;
              if ((int)sVar1 != 0) {
                puVar2 = (uint8_t *)realloc(puVar2,(ulong)nr_of_compressed_bytes);
                sVar1 = read((int)puVar2,(void *)0x1,(ulong)nr_of_compressed_bytes);
                if ((int)sVar1 != 0) {
                  trico_decompress_double_precision(&nr_of_doubles_z,&decompressed_z,puVar2);
                  free(puVar2);
                  if (nr_of_doubles_x != nr_vertices) {
                    __assert_fail("nr_of_doubles_x == nr_vertices",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x41d,
                                  "int trico_read_vec3_double(void *, double **, enum trico_stream_type)"
                                 );
                  }
                  if (nr_of_doubles_x != nr_of_doubles_y) {
                    __assert_fail("nr_of_doubles_x == nr_of_doubles_y",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x41e,
                                  "int trico_read_vec3_double(void *, double **, enum trico_stream_type)"
                                 );
                  }
                  if (nr_of_doubles_x != nr_of_doubles_z) {
                    __assert_fail("nr_of_doubles_x == nr_of_doubles_z",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x41f,
                                  "int trico_read_vec3_double(void *, double **, enum trico_stream_type)"
                                 );
                  }
                  if (vertices != (double **)0x0) {
                    trico_transpose_xyz_soa_to_aos_double_precision
                              (vertices,decompressed_x,decompressed_y,decompressed_z,nr_of_doubles_x
                              );
                  }
                  free(decompressed_x);
                  free(decompressed_y);
                  free(decompressed_z);
                  read_next_stream_type((trico_archive *)a);
                  iVar3 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int trico_read_vec3_double(void* a, double** vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;

  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vertices;
  if (!read(&nr_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_x;
  uint32_t nr_of_doubles_x;
  trico_decompress_double_precision(&nr_of_doubles_x, &decompressed_x, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_y;
  uint32_t nr_of_doubles_y;
  trico_decompress_double_precision(&nr_of_doubles_y, &decompressed_y, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_z;
  uint32_t nr_of_doubles_z;
  trico_decompress_double_precision(&nr_of_doubles_z, &decompressed_z, (const uint8_t*)compressed);
  trico_free(compressed);

  assert(nr_of_doubles_x == nr_vertices);
  assert(nr_of_doubles_x == nr_of_doubles_y);
  assert(nr_of_doubles_x == nr_of_doubles_z);

  if (vertices != NULL)
    trico_transpose_xyz_soa_to_aos_double_precision(vertices, decompressed_x, decompressed_y, decompressed_z, nr_vertices);

  trico_free(decompressed_x);
  trico_free(decompressed_y);
  trico_free(decompressed_z);

  read_next_stream_type(arch);

  return 1;
  }